

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LNode.h
# Opt level: O0

void __thiscall
LNodeData<LNodeAtom>::LNodeData(LNodeData<LNodeAtom> *this,LNodeType type,LNodeAtom *value)

{
  LNodeAtom *value_local;
  LNodeType type_local;
  LNodeData<LNodeAtom> *this_local;
  
  LNode::LNode(&this->super_LNode,type);
  (this->super_LNode)._vptr_LNode = (_func_int **)&PTR__LNodeData_00156718;
  memset(&this->value,0,0x20);
  LNodeAtom::LNodeAtom(&this->value);
  LNodeAtom::operator=(&this->value,value);
  return;
}

Assistant:

LNodeData(LNodeType type, T &&value) : LNode(type) {
        this->value = std::move(value);
    }